

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O3

bool __thiscall
cmSetTargetPropertiesCommand::InitialPass
          (cmSetTargetPropertiesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  pointer pbVar4;
  long lVar5;
  long lVar6;
  pointer pbVar7;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propertyPairs;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar4 - (long)pbVar7) < 0x21) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pbVar7 != pbVar4) {
    lVar6 = 0;
    pbVar4 = pbVar7;
    do {
      pbVar4 = pbVar4 + 1;
      iVar2 = std::__cxx11::string::compare((char *)pbVar7);
      if (iVar2 == 0) {
        if (((int)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (int)pbVar4 & 0x20U) != 0) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"called with incorrect number of arguments.","");
          cmCommand::SetError(&this->super_cmCommand,&local_68);
          goto LAB_002202c4;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,0,
                   pbVar7 + 1);
        if (local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar3 = true;
          if ((int)lVar6 == 0) goto LAB_002202dc;
          lVar5 = 0;
          goto LAB_00220336;
        }
        break;
      }
      pbVar7 = pbVar7 + 1;
      lVar6 = lVar6 + 1;
    } while (pbVar7 != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "called with illegal arguments, maybe missing a PROPERTIES specifier?","");
  cmCommand::SetError(&this->super_cmCommand,&local_68);
LAB_002202c4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_002202cd:
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_002202da:
  bVar3 = false;
  goto LAB_002202dc;
  while( true ) {
    lVar5 = lVar5 + 0x20;
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) break;
LAB_00220336:
    bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,
                                (string *)
                                ((long)&(((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar5));
    if (bVar1) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"can not be used on an ALIAS target.","");
      cmCommand::SetError(&this->super_cmCommand,&local_68);
      goto LAB_002202c4;
    }
    bVar1 = SetOneTarget((string *)
                         ((long)&(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar5),&local_48,(this->super_cmCommand).Makefile);
    if (!bVar1) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Can not find target to add properties to: ","");
      std::__cxx11::string::_M_append
                ((char *)&local_68,
                 *(ulong *)((long)&(((args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                           + lVar5));
      cmCommand::SetError(&this->super_cmCommand,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_002202cd;
      goto LAB_002202da;
    }
  }
LAB_002202dc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return bVar3;
}

Assistant:

bool cmSetTargetPropertiesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // first collect up the list of files
  std::vector<std::string> propertyPairs;
  int numFiles = 0;
  std::vector<std::string>::const_iterator j;
  for (j = args.begin(); j != args.end(); ++j) {
    if (*j == "PROPERTIES") {
      // now loop through the rest of the arguments, new style
      ++j;
      if (std::distance(j, args.end()) % 2 != 0) {
        this->SetError("called with incorrect number of arguments.");
        return false;
      }
      propertyPairs.insert(propertyPairs.end(), j, args.end());
      break;
    }
    numFiles++;
  }
  if (propertyPairs.empty()) {
    this->SetError("called with illegal arguments, maybe missing "
                   "a PROPERTIES specifier?");
    return false;
  }

  // now loop over all the targets
  int i;
  for (i = 0; i < numFiles; ++i) {
    if (this->Makefile->IsAlias(args[i])) {
      this->SetError("can not be used on an ALIAS target.");
      return false;
    }
    bool ret = cmSetTargetPropertiesCommand::SetOneTarget(
      args[i], propertyPairs, this->Makefile);
    if (!ret) {
      std::string message = "Can not find target to add properties to: ";
      message += args[i];
      this->SetError(message);
      return false;
    }
  }
  return true;
}